

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_cconvert.c
# Opt level: O2

int sp_cconvert(int m,int n,singlecomplex *A,int lda,int kl,int ku,singlecomplex *a,int_t *asub,
               int_t *xa,int_t *nnz)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  uVar2 = -ku;
  uVar5 = 0;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  iVar6 = 0;
  for (uVar3 = 0; uVar3 != uVar5; uVar3 = uVar3 + 1) {
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    xa[uVar3] = iVar6;
    lVar8 = (long)iVar6;
    iVar1 = (int)uVar3 - ku;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    iVar7 = (int)((long)kl + uVar3);
    if ((long)n <= (long)((long)kl + uVar3)) {
      iVar7 = n + -1;
    }
    for (; (long)uVar4 <= (long)iVar7; uVar4 = uVar4 + 1) {
      a[lVar8] = A[uVar4];
      asub[lVar8] = (int_t)uVar4;
      lVar8 = lVar8 + 1;
    }
    iVar6 = (iVar6 - iVar1) + iVar7 + 1;
    uVar2 = uVar2 + 1;
    A = A + lda;
  }
  *nnz = iVar6;
  xa[n] = iVar6;
  return 0;
}

Assistant:

int
sp_cconvert(int m, int n, singlecomplex *A, int lda, int kl, int ku,
	   singlecomplex *a, int_t *asub, int_t *xa, int_t *nnz)
{
    int_t     lasta = 0;
    int_t     i, j, ilow, ihigh;
    int_t     *row;
    singlecomplex  *val;

    for (j = 0; j < n; ++j) {
	xa[j] = lasta;
	val = &a[xa[j]];
	row = &asub[xa[j]];

	ilow = SUPERLU_MAX(0, j - ku);
	ihigh = SUPERLU_MIN(n-1, j + kl);
	for (i = ilow; i <= ihigh; ++i) {
	    val[i-ilow] = A[i + j*lda];
	    row[i-ilow] = i;
	}
	lasta += ihigh - ilow + 1;
    }

    xa[n] = *nnz = lasta;
    return 0;
}